

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactions.h
# Opt level: O2

int64_t INTERACTIONS::choose(int64_t n,int64_t k)

{
  long lVar1;
  int64_t iVar2;
  int64_t iVar3;
  
  if (k < 0 || n < k) {
    return 0;
  }
  iVar2 = 1;
  if ((k != n) && (n == 0 || k != 0)) {
    for (iVar3 = iVar2; iVar3 - k != 1; iVar3 = iVar3 + 1) {
      lVar1 = iVar2 * n;
      n = n + -1;
      iVar2 = lVar1 / iVar3;
    }
  }
  return iVar2;
}

Assistant:

inline int64_t choose(int64_t n, int64_t k)
{
  if (k > n)
    return 0;
  if (k < 0)
    return 0;
  if (k == n)
    return 1;
  if (k == 0 && n != 0)
    return 1;
  int64_t r = 1;
  for (int64_t d = 1; d <= k; ++d)
  {
    r *= n--;
    r /= d;
  }
  return r;
}